

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS
ref_shard_add_pri_as_tet(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *nodes,REF_BOOL check_volume)

{
  uint uVar1;
  REF_GLOB local_388;
  long local_380;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  long local_358;
  long local_350;
  long local_340;
  REF_GLOB local_338;
  double dStack_328;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_DBL vol_4;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_DBL vol_3;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_DBL vol_2;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_DBL vol_1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_DBL vol;
  uint local_2d8;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT tet_nodes [27];
  uint local_264;
  REF_INT pri_nodes [27];
  REF_GLOB pri_global [27];
  long local_118;
  REF_GLOB global [27];
  REF_GLOB minnode;
  REF_INT node;
  REF_BOOL check_volume_local;
  REF_INT *nodes_local;
  REF_CELL ref_cell_local;
  REF_NODE ref_node_local;
  
  for (minnode._0_4_ = 0; (int)minnode < 6; minnode._0_4_ = (int)minnode + 1) {
    if (((nodes[(int)minnode] < 0) || (ref_node->max <= nodes[(int)minnode])) ||
       (ref_node->global[nodes[(int)minnode]] < 0)) {
      local_338 = -1;
    }
    else {
      local_338 = ref_node->global[nodes[(int)minnode]];
    }
    global[(long)(int)minnode + -1] = local_338;
  }
  if (local_118 < global[0]) {
    local_340 = local_118;
  }
  else {
    local_340 = global[0];
  }
  if (global[1] < global[2]) {
    local_350 = global[1];
  }
  else {
    local_350 = global[2];
  }
  if (local_340 < local_350) {
    if (local_118 < global[0]) {
      local_358 = local_118;
    }
    else {
      local_358 = global[0];
    }
    local_360 = local_358;
  }
  else {
    if (global[1] < global[2]) {
      local_368 = global[1];
    }
    else {
      local_368 = global[2];
    }
    local_360 = local_368;
  }
  if (global[3] < global[4]) {
    local_370 = global[3];
  }
  else {
    local_370 = global[4];
  }
  if (local_370 < local_360) {
    if (global[3] < global[4]) {
      local_378 = global[3];
    }
    else {
      local_378 = global[4];
    }
    local_380 = local_378;
  }
  else {
    local_380 = local_360;
  }
  tet_nodes[0x1a] = *nodes;
  local_264 = nodes[1];
  pri_nodes[0] = nodes[2];
  pri_nodes[1] = nodes[3];
  pri_nodes[2] = nodes[4];
  pri_nodes[3] = nodes[5];
  if (global[0] == local_380) {
    tet_nodes[0x1a] = nodes[1];
    local_264 = nodes[2];
    pri_nodes[0] = *nodes;
    pri_nodes[1] = nodes[4];
    pri_nodes[2] = nodes[5];
    pri_nodes[3] = nodes[3];
  }
  if (global[1] == local_380) {
    tet_nodes[0x1a] = nodes[2];
    local_264 = *nodes;
    pri_nodes[0] = nodes[1];
    pri_nodes[1] = nodes[5];
    pri_nodes[2] = nodes[3];
    pri_nodes[3] = nodes[4];
  }
  if (global[2] == local_380) {
    tet_nodes[0x1a] = nodes[3];
    local_264 = nodes[5];
    pri_nodes[0] = nodes[4];
    pri_nodes[1] = *nodes;
    pri_nodes[2] = nodes[2];
    pri_nodes[3] = nodes[1];
  }
  if (global[3] == local_380) {
    tet_nodes[0x1a] = nodes[4];
    local_264 = nodes[3];
    pri_nodes[0] = nodes[5];
    pri_nodes[1] = nodes[1];
    pri_nodes[2] = *nodes;
    pri_nodes[3] = nodes[2];
  }
  if (global[4] == local_380) {
    tet_nodes[0x1a] = nodes[5];
    local_264 = nodes[4];
    pri_nodes[0] = nodes[3];
    pri_nodes[1] = nodes[2];
    pri_nodes[2] = nodes[1];
    pri_nodes[3] = *nodes;
  }
  local_2d8 = tet_nodes[0x1a];
  ref_private_macro_code_rss = pri_nodes[2];
  tet_nodes[0] = pri_nodes[3];
  tet_nodes[1] = pri_nodes[1];
  vol._4_4_ = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_2d8);
  if (vol._4_4_ != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x225,
           "ref_shard_add_pri_as_tet",(ulong)vol._4_4_,"add tet");
    return vol._4_4_;
  }
  if (check_volume != 0) {
    vol_1._4_4_ = ref_node_tet_vol(ref_node,(REF_INT *)&local_2d8,
                                   (REF_DBL *)&ref_private_macro_code_rss_2);
    if (vol_1._4_4_ != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x226
             ,"ref_shard_add_pri_as_tet",(ulong)vol_1._4_4_,"tet vol");
      return vol_1._4_4_;
    }
    if (_ref_private_macro_code_rss_2 <= 0.0) {
      printf("tet vol %e\n",_ref_private_macro_code_rss_2);
      printf("minnode %ld\n",local_380);
      printf("nodes %d %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
             (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4],nodes[5]);
      printf("prism %d %d %d %d %d %d\n",(ulong)(uint)tet_nodes[0x1a],(ulong)local_264,
             (ulong)(uint)pri_nodes[0],(ulong)(uint)pri_nodes[1],(ulong)(uint)pri_nodes[2],
             pri_nodes[3]);
      printf("tet %d %d %d %d\n",(ulong)local_2d8,(ulong)(uint)ref_private_macro_code_rss,
             (ulong)(uint)tet_nodes[0],(ulong)(uint)tet_nodes[1]);
    }
  }
  for (minnode._0_4_ = 0; (int)minnode < 6; minnode._0_4_ = (int)minnode + 1) {
    if (((tet_nodes[(long)(int)minnode + 0x1a] < 0) ||
        (ref_node->max <= tet_nodes[(long)(int)minnode + 0x1a])) ||
       (ref_node->global[tet_nodes[(long)(int)minnode + 0x1a]] < 0)) {
      local_388 = -1;
    }
    else {
      local_388 = ref_node->global[tet_nodes[(long)(int)minnode + 0x1a]];
    }
    *(REF_GLOB *)(pri_nodes + (long)(int)minnode * 2 + 0x1a) = local_388;
  }
  if (((pri_global[0] < pri_global[1]) && (pri_global[0] < pri_global[3])) ||
     ((pri_global[4] < pri_global[1] && (pri_global[4] < pri_global[3])))) {
    local_2d8 = tet_nodes[0x1a];
    ref_private_macro_code_rss = local_264;
    tet_nodes[0] = pri_nodes[3];
    tet_nodes[1] = pri_nodes[2];
    vol_1._0_4_ = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_2d8);
    if (vol_1._0_4_ != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x231
             ,"ref_shard_add_pri_as_tet",(ulong)vol_1._0_4_,"a tet");
      return vol_1._0_4_;
    }
    if (check_volume != 0) {
      vol_2._4_4_ = ref_node_tet_vol(ref_node,(REF_INT *)&local_2d8,
                                     (REF_DBL *)&ref_private_macro_code_rss_4);
      if (vol_2._4_4_ != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x232,"ref_shard_add_pri_as_tet",(ulong)vol_2._4_4_,"tet vol");
        return vol_2._4_4_;
      }
      if (_ref_private_macro_code_rss_4 <= 0.0) {
        printf("tet vol %e\n",_ref_private_macro_code_rss_4);
        printf("minnode %ld\n",local_380);
        printf("nodes %d %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
               (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4],nodes[5]);
        printf("prism %d %d %d %d %d %d\n",(ulong)(uint)tet_nodes[0x1a],(ulong)local_264,
               (ulong)(uint)pri_nodes[0],(ulong)(uint)pri_nodes[1],(ulong)(uint)pri_nodes[2],
               pri_nodes[3]);
        printf("tet %d %d %d %d\n",(ulong)local_2d8,(ulong)(uint)ref_private_macro_code_rss,
               (ulong)(uint)tet_nodes[0],(ulong)(uint)tet_nodes[1]);
      }
    }
    local_2d8 = tet_nodes[0x1a];
    ref_private_macro_code_rss = local_264;
    tet_nodes[0] = pri_nodes[0];
    tet_nodes[1] = pri_nodes[3];
    vol_2._0_4_ = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_2d8);
    if (vol_2._0_4_ != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x238
             ,"ref_shard_add_pri_as_tet",(ulong)vol_2._0_4_,"a tet");
      return vol_2._0_4_;
    }
    if (check_volume != 0) {
      vol_3._4_4_ = ref_node_tet_vol(ref_node,(REF_INT *)&local_2d8,
                                     (REF_DBL *)&ref_private_macro_code_rss_6);
      if (vol_3._4_4_ != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x239,"ref_shard_add_pri_as_tet",(ulong)vol_3._4_4_,"tet vol");
        return vol_3._4_4_;
      }
      if (_ref_private_macro_code_rss_6 <= 0.0) {
        printf("tet vol %e\n",_ref_private_macro_code_rss_6);
        printf("minnode %ld\n",local_380);
        printf("nodes %d %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
               (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4],nodes[5]);
        printf("prism %d %d %d %d %d %d\n",(ulong)(uint)tet_nodes[0x1a],(ulong)local_264,
               (ulong)(uint)pri_nodes[0],(ulong)(uint)pri_nodes[1],(ulong)(uint)pri_nodes[2],
               pri_nodes[3]);
        printf("tet %d %d %d %d\n",(ulong)local_2d8,(ulong)(uint)ref_private_macro_code_rss,
               (ulong)(uint)tet_nodes[0],(ulong)(uint)tet_nodes[1]);
      }
    }
  }
  else {
    local_2d8 = pri_nodes[0];
    ref_private_macro_code_rss = tet_nodes[0x1a];
    tet_nodes[0] = pri_nodes[2];
    tet_nodes[1] = pri_nodes[3];
    vol_3._0_4_ = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_2d8);
    if (vol_3._0_4_ != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x23f
             ,"ref_shard_add_pri_as_tet",(ulong)vol_3._0_4_,"a tet");
      return vol_3._0_4_;
    }
    if (check_volume != 0) {
      vol_4._4_4_ = ref_node_tet_vol(ref_node,(REF_INT *)&local_2d8,
                                     (REF_DBL *)&ref_private_macro_code_rss_8);
      if (vol_4._4_4_ != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x240,"ref_shard_add_pri_as_tet",(ulong)vol_4._4_4_,"tet vol");
        return vol_4._4_4_;
      }
      if (_ref_private_macro_code_rss_8 <= 0.0) {
        printf("tet vol %e\n",_ref_private_macro_code_rss_8);
        printf("minnode %ld\n",local_380);
        printf("nodes %d %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
               (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4],nodes[5]);
        printf("prism %d %d %d %d %d %d\n",(ulong)(uint)tet_nodes[0x1a],(ulong)local_264,
               (ulong)(uint)pri_nodes[0],(ulong)(uint)pri_nodes[1],(ulong)(uint)pri_nodes[2],
               pri_nodes[3]);
        printf("tet %d %d %d %d\n",(ulong)local_2d8,(ulong)(uint)ref_private_macro_code_rss,
               (ulong)(uint)tet_nodes[0],(ulong)(uint)tet_nodes[1]);
      }
    }
    local_2d8 = tet_nodes[0x1a];
    ref_private_macro_code_rss = local_264;
    tet_nodes[0] = pri_nodes[0];
    tet_nodes[1] = pri_nodes[2];
    vol_4._0_4_ = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_2d8);
    if (vol_4._0_4_ != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x246
             ,"ref_shard_add_pri_as_tet",(ulong)vol_4._0_4_,"a tet");
      return vol_4._0_4_;
    }
    if (check_volume != 0) {
      uVar1 = ref_node_tet_vol(ref_node,(REF_INT *)&local_2d8,&stack0xfffffffffffffcd8);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x247,"ref_shard_add_pri_as_tet",(ulong)uVar1,"tet vol");
        return uVar1;
      }
      if (dStack_328 <= 0.0) {
        printf("tet vol %e\n",dStack_328);
        printf("minnode %ld\n",local_380);
        printf("nodes %d %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
               (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4],nodes[5]);
        printf("prism %d %d %d %d %d %d\n",(ulong)(uint)tet_nodes[0x1a],(ulong)local_264,
               (ulong)(uint)pri_nodes[0],(ulong)(uint)pri_nodes[1],(ulong)(uint)pri_nodes[2],
               pri_nodes[3]);
        printf("tet %d %d %d %d\n",(ulong)local_2d8,(ulong)(uint)ref_private_macro_code_rss,
               (ulong)(uint)tet_nodes[0],(ulong)(uint)tet_nodes[1]);
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_add_pri_as_tet(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *nodes,
                                                   REF_BOOL check_volume) {
  REF_INT node;
  REF_GLOB minnode, global[REF_CELL_MAX_SIZE_PER];
  REF_GLOB pri_global[REF_CELL_MAX_SIZE_PER];
  REF_INT pri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];

  for (node = 0; node < 6; node++)
    global[node] = ref_node_global(ref_node, nodes[node]);

  minnode = MIN(MIN(global[0], global[1]), MIN(global[2], global[3]));
  minnode = MIN(MIN(global[4], global[5]), minnode);

  pri_nodes[0] = nodes[0];
  pri_nodes[1] = nodes[1];
  pri_nodes[2] = nodes[2];
  pri_nodes[3] = nodes[3];
  pri_nodes[4] = nodes[4];
  pri_nodes[5] = nodes[5];

  if (global[1] == minnode) {
    pri_nodes[0] = nodes[1];
    pri_nodes[1] = nodes[2];
    pri_nodes[2] = nodes[0];
    pri_nodes[3] = nodes[4];
    pri_nodes[4] = nodes[5];
    pri_nodes[5] = nodes[3];
  }

  if (global[2] == minnode) {
    pri_nodes[0] = nodes[2];
    pri_nodes[1] = nodes[0];
    pri_nodes[2] = nodes[1];
    pri_nodes[3] = nodes[5];
    pri_nodes[4] = nodes[3];
    pri_nodes[5] = nodes[4];
  }

  if (global[3] == minnode) {
    pri_nodes[0] = nodes[3];
    pri_nodes[1] = nodes[5];
    pri_nodes[2] = nodes[4];
    pri_nodes[3] = nodes[0];
    pri_nodes[4] = nodes[2];
    pri_nodes[5] = nodes[1];
  }

  if (global[4] == minnode) {
    pri_nodes[0] = nodes[4];
    pri_nodes[1] = nodes[3];
    pri_nodes[2] = nodes[5];
    pri_nodes[3] = nodes[1];
    pri_nodes[4] = nodes[0];
    pri_nodes[5] = nodes[2];
  }

  if (global[5] == minnode) {
    pri_nodes[0] = nodes[5];
    pri_nodes[1] = nodes[4];
    pri_nodes[2] = nodes[3];
    pri_nodes[3] = nodes[2];
    pri_nodes[4] = nodes[1];
    pri_nodes[5] = nodes[0];
  }

  /* node 0 is now the smallest global index of prism */

  tet_nodes[0] = pri_nodes[0];
  tet_nodes[1] = pri_nodes[4];
  tet_nodes[2] = pri_nodes[5];
  tet_nodes[3] = pri_nodes[3];
  RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "add tet");
  if (check_volume) check_tet_volume();

  for (node = 0; node < 6; node++)
    pri_global[node] = ref_node_global(ref_node, pri_nodes[node]);

  if ((pri_global[1] < pri_global[2] && pri_global[1] < pri_global[4]) ||
      (pri_global[5] < pri_global[2] && pri_global[5] < pri_global[4])) {
    tet_nodes[0] = pri_nodes[0];
    tet_nodes[1] = pri_nodes[1];
    tet_nodes[2] = pri_nodes[5];
    tet_nodes[3] = pri_nodes[4];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();

    tet_nodes[0] = pri_nodes[0];
    tet_nodes[1] = pri_nodes[1];
    tet_nodes[2] = pri_nodes[2];
    tet_nodes[3] = pri_nodes[5];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();
  } else {
    tet_nodes[0] = pri_nodes[2];
    tet_nodes[1] = pri_nodes[0];
    tet_nodes[2] = pri_nodes[4];
    tet_nodes[3] = pri_nodes[5];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();

    tet_nodes[0] = pri_nodes[0];
    tet_nodes[1] = pri_nodes[1];
    tet_nodes[2] = pri_nodes[2];
    tet_nodes[3] = pri_nodes[4];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();
  }

  return REF_SUCCESS;
}